

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Flatten_x86::forward(Flatten_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int *piVar6;
  size_t sVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  size_t sVar28;
  long lVar29;
  void *pvVar30;
  uint uVar31;
  byte bVar32;
  int iVar33;
  long lVar34;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  void *pvVar39;
  ulong uVar40;
  long lVar41;
  int iVar42;
  long lVar43;
  
  iVar23 = bottom_blob->elempack;
  if (((long)iVar23 != 0) && (((int)bottom_blob->elemsize << 3) / iVar23 == 8)) {
    iVar23 = forward_int8(this,bottom_blob,top_blob,opt);
    return iVar23;
  }
  uVar3 = bottom_blob->dims;
  if (uVar3 == 1) {
    iVar24 = 0;
    if (top_blob != bottom_blob) {
      piVar6 = bottom_blob->refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      piVar6 = top_blob->refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            free(top_blob->data);
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      iVar24 = 0;
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->c = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      piVar6 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar6;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar23 = bottom_blob->w;
      iVar33 = bottom_blob->h;
      iVar42 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar23;
      top_blob->h = iVar33;
      top_blob->d = iVar42;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
    }
  }
  else {
    iVar33 = bottom_blob->w;
    lVar41 = (long)iVar33;
    uVar4 = bottom_blob->h;
    uVar5 = bottom_blob->c;
    uVar37 = (ulong)uVar5;
    iVar42 = uVar4 * iVar33 * bottom_blob->d;
    uVar31 = uVar5 * iVar23 * iVar42;
    bVar32 = (uVar31 & 3) == 0 & opt->use_packing_layout;
    sVar28 = bottom_blob->elemsize / (ulong)(long)iVar23 << bVar32 * '\x02';
    if (bVar32 == 0) {
      iVar23 = Flatten::forward(&this->super_Flatten,bottom_blob,top_blob,opt);
      return iVar23;
    }
    iVar24 = (int)uVar31 >> 2;
    if (iVar23 == 1 && (uVar3 ^ 2) == 0) {
      if (top_blob != bottom_blob) {
        piVar6 = bottom_blob->refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = top_blob->refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        top_blob->c = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        piVar6 = bottom_blob->refcount;
        top_blob->data = bottom_blob->data;
        top_blob->refcount = piVar6;
        top_blob->allocator = bottom_blob->allocator;
        iVar23 = bottom_blob->c;
        top_blob->d = bottom_blob->d;
        top_blob->c = iVar23;
      }
      top_blob->dims = 1;
      top_blob->w = iVar24;
      top_blob->h = 1;
      top_blob->cstep = (long)iVar24;
      top_blob->elemsize = sVar28;
      top_blob->elempack = 4;
      iVar24 = 0;
    }
    else {
      Mat::create(top_blob,iVar24,sVar28,4,opt->blob_allocator);
      iVar24 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        if (iVar23 == 4 && (uVar3 ^ 2) == 0) {
          uVar40 = 0;
          uVar35 = (ulong)uVar4;
          if ((int)uVar4 < 1) {
            uVar35 = uVar40;
          }
          lVar29 = lVar41 * 0xc;
          lVar34 = lVar41 * 0x10;
          lVar36 = lVar41 * 8;
          lVar41 = lVar41 * 4;
          for (uVar38 = 0; uVar38 != uVar35; uVar38 = uVar38 + 1) {
            iVar24 = (int)uVar40;
            pvVar39 = top_blob->data;
            lVar25 = bottom_blob->elemsize * uVar38 * (long)bottom_blob->w;
            pvVar30 = bottom_blob->data;
            lVar26 = 0;
            for (iVar27 = 0; iVar27 + 3 < iVar33; iVar27 = iVar27 + 4) {
              puVar1 = (undefined4 *)((long)pvVar30 + lVar26 * 4 + lVar25);
              uVar8 = puVar1[1];
              uVar9 = puVar1[2];
              uVar10 = puVar1[3];
              puVar2 = (undefined4 *)((long)pvVar30 + lVar26 * 4 + lVar25 + 0x10);
              uVar11 = *puVar2;
              uVar12 = puVar2[1];
              uVar13 = puVar2[2];
              uVar14 = puVar2[3];
              puVar2 = (undefined4 *)((long)pvVar30 + lVar26 * 4 + lVar25 + 0x20);
              uVar15 = *puVar2;
              uVar16 = puVar2[1];
              uVar17 = puVar2[2];
              uVar18 = puVar2[3];
              puVar2 = (undefined4 *)((long)pvVar30 + lVar26 * 4 + lVar25 + 0x30);
              uVar19 = *puVar2;
              uVar20 = puVar2[1];
              uVar21 = puVar2[2];
              uVar22 = puVar2[3];
              puVar2 = (undefined4 *)((long)pvVar39 + lVar26 + (long)iVar24 * 4);
              *puVar2 = *puVar1;
              puVar2[1] = uVar11;
              puVar2[2] = uVar15;
              puVar2[3] = uVar19;
              puVar1 = (undefined4 *)((long)pvVar39 + lVar26 + lVar41);
              *puVar1 = uVar8;
              puVar1[1] = uVar12;
              puVar1[2] = uVar16;
              puVar1[3] = uVar20;
              puVar1 = (undefined4 *)((long)pvVar39 + lVar26 + lVar36);
              *puVar1 = uVar9;
              puVar1[1] = uVar13;
              puVar1[2] = uVar17;
              puVar1[3] = uVar21;
              puVar1 = (undefined4 *)((long)pvVar39 + lVar26 + lVar29);
              *puVar1 = uVar10;
              puVar1[1] = uVar14;
              puVar1[2] = uVar18;
              puVar1[3] = uVar22;
              lVar26 = lVar26 + 0x10;
            }
            for (; iVar27 < iVar33; iVar27 = iVar27 + 1) {
              *(undefined4 *)((long)pvVar39 + lVar26 + (long)iVar24 * 4) =
                   *(undefined4 *)((long)pvVar30 + lVar26 * 4 + lVar25);
              *(undefined4 *)((long)pvVar39 + lVar26 + lVar41) =
                   *(undefined4 *)((long)pvVar30 + lVar26 * 4 + lVar25 + 4);
              *(undefined4 *)((long)pvVar39 + lVar26 + lVar36) =
                   *(undefined4 *)((long)pvVar30 + lVar26 * 4 + lVar25 + 8);
              *(undefined4 *)((long)pvVar39 + lVar26 + lVar29) =
                   *(undefined4 *)((long)pvVar30 + lVar26 * 4 + lVar25 + 0xc);
              lVar26 = lVar26 + 4;
            }
            lVar29 = lVar29 + lVar34;
            lVar36 = lVar36 + lVar34;
            lVar41 = lVar41 + lVar34;
            uVar40 = (ulong)(uint)(iVar24 + iVar33 * 4);
          }
        }
        iVar24 = 0;
        if (uVar3 - 3 < 2) {
          lVar41 = (long)iVar42;
          if (iVar23 == 4) {
            iVar33 = 0;
            uVar35 = 0;
            if (0 < (int)uVar5) {
              uVar35 = uVar37;
            }
            lVar36 = lVar41 * 4;
            lVar34 = lVar41 * 0x10;
            lVar29 = lVar41 * 8;
            lVar25 = lVar41 * 0xc;
            for (uVar40 = 0; uVar40 != uVar35; uVar40 = uVar40 + 1) {
              pvVar39 = top_blob->data;
              lVar26 = bottom_blob->elemsize * bottom_blob->cstep * uVar40;
              pvVar30 = bottom_blob->data;
              lVar43 = 0;
              for (iVar24 = 0; iVar24 + 3 < iVar42; iVar24 = iVar24 + 4) {
                puVar2 = (undefined4 *)((long)pvVar30 + lVar43 * 4 + lVar26);
                uVar8 = puVar2[1];
                uVar9 = puVar2[2];
                uVar10 = puVar2[3];
                puVar1 = (undefined4 *)((long)pvVar30 + lVar43 * 4 + lVar26 + 0x10);
                uVar11 = *puVar1;
                uVar12 = puVar1[1];
                uVar13 = puVar1[2];
                uVar14 = puVar1[3];
                puVar1 = (undefined4 *)((long)pvVar30 + lVar43 * 4 + lVar26 + 0x20);
                uVar15 = *puVar1;
                uVar16 = puVar1[1];
                uVar17 = puVar1[2];
                uVar18 = puVar1[3];
                puVar1 = (undefined4 *)((long)pvVar30 + lVar43 * 4 + lVar26 + 0x30);
                uVar19 = *puVar1;
                uVar20 = puVar1[1];
                uVar21 = puVar1[2];
                uVar22 = puVar1[3];
                puVar1 = (undefined4 *)((long)pvVar39 + lVar43 + (long)iVar33 * 4);
                *puVar1 = *puVar2;
                puVar1[1] = uVar11;
                puVar1[2] = uVar15;
                puVar1[3] = uVar19;
                puVar1 = (undefined4 *)((long)pvVar39 + lVar43 + lVar36);
                *puVar1 = uVar8;
                puVar1[1] = uVar12;
                puVar1[2] = uVar16;
                puVar1[3] = uVar20;
                puVar1 = (undefined4 *)((long)pvVar39 + lVar43 + lVar29);
                *puVar1 = uVar9;
                puVar1[1] = uVar13;
                puVar1[2] = uVar17;
                puVar1[3] = uVar21;
                puVar1 = (undefined4 *)((long)pvVar39 + lVar43 + lVar25);
                *puVar1 = uVar10;
                puVar1[1] = uVar14;
                puVar1[2] = uVar18;
                puVar1[3] = uVar22;
                lVar43 = lVar43 + 0x10;
              }
              for (; iVar24 < iVar42; iVar24 = iVar24 + 1) {
                *(undefined4 *)((long)pvVar39 + lVar43 + (long)iVar33 * 4) =
                     *(undefined4 *)((long)pvVar30 + lVar43 * 4 + lVar26);
                *(undefined4 *)((long)pvVar39 + lVar43 + lVar36) =
                     *(undefined4 *)((long)pvVar30 + lVar43 * 4 + lVar26 + 4);
                *(undefined4 *)((long)pvVar39 + lVar43 + lVar29) =
                     *(undefined4 *)((long)pvVar30 + lVar43 * 4 + lVar26 + 8);
                *(undefined4 *)((long)pvVar39 + lVar43 + lVar25) =
                     *(undefined4 *)((long)pvVar30 + lVar43 * 4 + lVar26 + 0xc);
                lVar43 = lVar43 + 4;
              }
              iVar33 = iVar33 + iVar42 * 4;
              lVar36 = lVar36 + lVar34;
              lVar29 = lVar29 + lVar34;
              lVar25 = lVar25 + lVar34;
            }
          }
          iVar24 = 0;
          if (iVar23 == 1) {
            pvVar39 = bottom_blob->data;
            sVar28 = bottom_blob->cstep;
            sVar7 = bottom_blob->elemsize;
            pvVar30 = top_blob->data;
            iVar24 = 0;
            if (iVar42 < 1) {
              iVar42 = 0;
            }
            if ((int)uVar5 < 1) {
              uVar37 = 0;
            }
            for (uVar35 = 0; uVar35 != uVar37; uVar35 = uVar35 + 1) {
              for (lVar36 = 0; iVar42 != (int)lVar36; lVar36 = lVar36 + 1) {
                *(undefined4 *)((long)pvVar30 + lVar36 * 4) =
                     *(undefined4 *)((long)pvVar39 + lVar36 * 4);
              }
              pvVar39 = (void *)((long)pvVar39 + sVar28 * sVar7);
              pvVar30 = (void *)((long)pvVar30 + lVar41 * 4);
            }
          }
        }
      }
    }
  }
  return iVar24;
}

Assistant:

int Flatten_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    int size = w * h * d;

    int total = size * channels * elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = total % 16 == 0 ? 16 : total % 8 == 0 ? 8 : total % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = total % 8 == 0 ? 8 : total % 4 == 0 ? 4 : 1;
#else
        out_elempack = total % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    if (out_elempack == 1)
    {
        return Flatten::forward(bottom_blob, top_blob, opt);
    }

    if (dims == 2 && elempack == 1) // out_elempack == 4 || out_elempack == 8 || out_elempack == 16
    {
        top_blob = bottom_blob;
        top_blob.dims = 1;
        top_blob.w = total / out_elempack;
        top_blob.h = 1;
        top_blob.cstep = top_blob.w;
        top_blob.elemsize = out_elemsize;
        top_blob.elempack = out_elempack;
        return 0;
    }

    top_blob.create(total / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (dims == 2)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16) // out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                float* outptr0 = (float*)top_blob + w * i * 16;
                float* outptr1 = (float*)top_blob + w * (i * 16 + 1);
                float* outptr2 = (float*)top_blob + w * (i * 16 + 2);
                float* outptr3 = (float*)top_blob + w * (i * 16 + 3);
                float* outptr4 = (float*)top_blob + w * (i * 16 + 4);
                float* outptr5 = (float*)top_blob + w * (i * 16 + 5);
                float* outptr6 = (float*)top_blob + w * (i * 16 + 6);
                float* outptr7 = (float*)top_blob + w * (i * 16 + 7);
                float* outptr8 = (float*)top_blob + w * (i * 16 + 8);
                float* outptr9 = (float*)top_blob + w * (i * 16 + 9);
                float* outptra = (float*)top_blob + w * (i * 16 + 10);
                float* outptrb = (float*)top_blob + w * (i * 16 + 11);
                float* outptrc = (float*)top_blob + w * (i * 16 + 12);
                float* outptrd = (float*)top_blob + w * (i * 16 + 13);
                float* outptre = (float*)top_blob + w * (i * 16 + 14);
                float* outptrf = (float*)top_blob + w * (i * 16 + 15);

                int j = 0;
                for (; j + 15 < w; j += 16)
                {
                    __m512 _r0 = _mm512_loadu_ps(ptr);
                    __m512 _r1 = _mm512_loadu_ps(ptr + 16);
                    __m512 _r2 = _mm512_loadu_ps(ptr + 16 * 2);
                    __m512 _r3 = _mm512_loadu_ps(ptr + 16 * 3);
                    __m512 _r4 = _mm512_loadu_ps(ptr + 16 * 4);
                    __m512 _r5 = _mm512_loadu_ps(ptr + 16 * 5);
                    __m512 _r6 = _mm512_loadu_ps(ptr + 16 * 6);
                    __m512 _r7 = _mm512_loadu_ps(ptr + 16 * 7);
                    __m512 _r8 = _mm512_loadu_ps(ptr + 16 * 8);
                    __m512 _r9 = _mm512_loadu_ps(ptr + 16 * 9);
                    __m512 _ra = _mm512_loadu_ps(ptr + 16 * 10);
                    __m512 _rb = _mm512_loadu_ps(ptr + 16 * 11);
                    __m512 _rc = _mm512_loadu_ps(ptr + 16 * 12);
                    __m512 _rd = _mm512_loadu_ps(ptr + 16 * 13);
                    __m512 _re = _mm512_loadu_ps(ptr + 16 * 14);
                    __m512 _rf = _mm512_loadu_ps(ptr + 16 * 15);

                    transpose16x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);

                    _mm512_storeu_ps(outptr0, _r0);
                    _mm512_storeu_ps(outptr1, _r1);
                    _mm512_storeu_ps(outptr2, _r2);
                    _mm512_storeu_ps(outptr3, _r3);
                    _mm512_storeu_ps(outptr4, _r4);
                    _mm512_storeu_ps(outptr5, _r5);
                    _mm512_storeu_ps(outptr6, _r6);
                    _mm512_storeu_ps(outptr7, _r7);
                    _mm512_storeu_ps(outptr8, _r8);
                    _mm512_storeu_ps(outptr9, _r9);
                    _mm512_storeu_ps(outptra, _ra);
                    _mm512_storeu_ps(outptrb, _rb);
                    _mm512_storeu_ps(outptrc, _rc);
                    _mm512_storeu_ps(outptrd, _rd);
                    _mm512_storeu_ps(outptre, _re);
                    _mm512_storeu_ps(outptrf, _rf);

                    outptr0 += 16;
                    outptr1 += 16;
                    outptr2 += 16;
                    outptr3 += 16;
                    outptr4 += 16;
                    outptr5 += 16;
                    outptr6 += 16;
                    outptr7 += 16;
                    outptr8 += 16;
                    outptr9 += 16;
                    outptra += 16;
                    outptrb += 16;
                    outptrc += 16;
                    outptrd += 16;
                    outptre += 16;
                    outptrf += 16;
                    ptr += 256;
                }
                for (; j < w; j++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];
                    *outptr8++ = ptr[8];
                    *outptr9++ = ptr[9];
                    *outptra++ = ptr[10];
                    *outptrb++ = ptr[11];
                    *outptrc++ = ptr[12];
                    *outptrd++ = ptr[13];
                    *outptre++ = ptr[14];
                    *outptrf++ = ptr[15];

                    ptr += 16;
                }
            }
        }
#endif // __AVX512F__

        if (elempack == 8) // out_elempack == 8 || out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                float* outptr0 = (float*)top_blob + w * i * 8;
                float* outptr1 = (float*)top_blob + w * (i * 8 + 1);
                float* outptr2 = (float*)top_blob + w * (i * 8 + 2);
                float* outptr3 = (float*)top_blob + w * (i * 8 + 3);
                float* outptr4 = (float*)top_blob + w * (i * 8 + 4);
                float* outptr5 = (float*)top_blob + w * (i * 8 + 5);
                float* outptr6 = (float*)top_blob + w * (i * 8 + 6);
                float* outptr7 = (float*)top_blob + w * (i * 8 + 7);

                int j = 0;
                for (; j + 7 < w; j += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr);
                    __m256 _row1 = _mm256_loadu_ps(ptr + 8);
                    __m256 _row2 = _mm256_loadu_ps(ptr + 16);
                    __m256 _row3 = _mm256_loadu_ps(ptr + 24);
                    __m256 _row4 = _mm256_loadu_ps(ptr + 32);
                    __m256 _row5 = _mm256_loadu_ps(ptr + 40);
                    __m256 _row6 = _mm256_loadu_ps(ptr + 48);
                    __m256 _row7 = _mm256_loadu_ps(ptr + 56);

                    transpose8x8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr0, _row0);
                    _mm256_storeu_ps(outptr1, _row1);
                    _mm256_storeu_ps(outptr2, _row2);
                    _mm256_storeu_ps(outptr3, _row3);
                    _mm256_storeu_ps(outptr4, _row4);
                    _mm256_storeu_ps(outptr5, _row5);
                    _mm256_storeu_ps(outptr6, _row6);
                    _mm256_storeu_ps(outptr7, _row7);

                    outptr0 += 8;
                    outptr1 += 8;
                    outptr2 += 8;
                    outptr3 += 8;
                    outptr4 += 8;
                    outptr5 += 8;
                    outptr6 += 8;
                    outptr7 += 8;
                    ptr += 64;
                }
                for (; j < w; j++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];

                    ptr += 8;
                }
            }
        }
#endif // __AVX__

        if (elempack == 4) // out_elempack == 4 || out_elempack == 8 || out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                float* outptr0 = (float*)top_blob + w * i * 4;
                float* outptr1 = (float*)top_blob + w * (i * 4 + 1);
                float* outptr2 = (float*)top_blob + w * (i * 4 + 2);
                float* outptr3 = (float*)top_blob + w * (i * 4 + 3);

                int j = 0;
                for (; j + 3 < w; j += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr);
                    __m128 _row1 = _mm_loadu_ps(ptr + 4);
                    __m128 _row2 = _mm_loadu_ps(ptr + 8);
                    __m128 _row3 = _mm_loadu_ps(ptr + 12);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr0, _row0);
                    _mm_storeu_ps(outptr1, _row1);
                    _mm_storeu_ps(outptr2, _row2);
                    _mm_storeu_ps(outptr3, _row3);

                    ptr += 16;
                    outptr0 += 4;
                    outptr1 += 4;
                    outptr2 += 4;
                    outptr3 += 4;
                }
                for (; j < w; j++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];

                    ptr += 4;
                }
            }
        }
#endif // __SSE2__
    }

    if (dims == 3 || dims == 4)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16) // out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr0 = (float*)top_blob + size * q * 16;
                float* outptr1 = (float*)top_blob + size * (q * 16 + 1);
                float* outptr2 = (float*)top_blob + size * (q * 16 + 2);
                float* outptr3 = (float*)top_blob + size * (q * 16 + 3);
                float* outptr4 = (float*)top_blob + size * (q * 16 + 4);
                float* outptr5 = (float*)top_blob + size * (q * 16 + 5);
                float* outptr6 = (float*)top_blob + size * (q * 16 + 6);
                float* outptr7 = (float*)top_blob + size * (q * 16 + 7);
                float* outptr8 = (float*)top_blob + size * (q * 16 + 8);
                float* outptr9 = (float*)top_blob + size * (q * 16 + 9);
                float* outptra = (float*)top_blob + size * (q * 16 + 10);
                float* outptrb = (float*)top_blob + size * (q * 16 + 11);
                float* outptrc = (float*)top_blob + size * (q * 16 + 12);
                float* outptrd = (float*)top_blob + size * (q * 16 + 13);
                float* outptre = (float*)top_blob + size * (q * 16 + 14);
                float* outptrf = (float*)top_blob + size * (q * 16 + 15);

                int i = 0;
                for (; i + 15 < size; i += 16)
                {
                    __m512 _r0 = _mm512_loadu_ps(ptr);
                    __m512 _r1 = _mm512_loadu_ps(ptr + 16);
                    __m512 _r2 = _mm512_loadu_ps(ptr + 16 * 2);
                    __m512 _r3 = _mm512_loadu_ps(ptr + 16 * 3);
                    __m512 _r4 = _mm512_loadu_ps(ptr + 16 * 4);
                    __m512 _r5 = _mm512_loadu_ps(ptr + 16 * 5);
                    __m512 _r6 = _mm512_loadu_ps(ptr + 16 * 6);
                    __m512 _r7 = _mm512_loadu_ps(ptr + 16 * 7);
                    __m512 _r8 = _mm512_loadu_ps(ptr + 16 * 8);
                    __m512 _r9 = _mm512_loadu_ps(ptr + 16 * 9);
                    __m512 _ra = _mm512_loadu_ps(ptr + 16 * 10);
                    __m512 _rb = _mm512_loadu_ps(ptr + 16 * 11);
                    __m512 _rc = _mm512_loadu_ps(ptr + 16 * 12);
                    __m512 _rd = _mm512_loadu_ps(ptr + 16 * 13);
                    __m512 _re = _mm512_loadu_ps(ptr + 16 * 14);
                    __m512 _rf = _mm512_loadu_ps(ptr + 16 * 15);

                    transpose16x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);

                    _mm512_storeu_ps(outptr0, _r0);
                    _mm512_storeu_ps(outptr1, _r1);
                    _mm512_storeu_ps(outptr2, _r2);
                    _mm512_storeu_ps(outptr3, _r3);
                    _mm512_storeu_ps(outptr4, _r4);
                    _mm512_storeu_ps(outptr5, _r5);
                    _mm512_storeu_ps(outptr6, _r6);
                    _mm512_storeu_ps(outptr7, _r7);
                    _mm512_storeu_ps(outptr8, _r8);
                    _mm512_storeu_ps(outptr9, _r9);
                    _mm512_storeu_ps(outptra, _ra);
                    _mm512_storeu_ps(outptrb, _rb);
                    _mm512_storeu_ps(outptrc, _rc);
                    _mm512_storeu_ps(outptrd, _rd);
                    _mm512_storeu_ps(outptre, _re);
                    _mm512_storeu_ps(outptrf, _rf);

                    outptr0 += 16;
                    outptr1 += 16;
                    outptr2 += 16;
                    outptr3 += 16;
                    outptr4 += 16;
                    outptr5 += 16;
                    outptr6 += 16;
                    outptr7 += 16;
                    outptr8 += 16;
                    outptr9 += 16;
                    outptra += 16;
                    outptrb += 16;
                    outptrc += 16;
                    outptrd += 16;
                    outptre += 16;
                    outptrf += 16;
                    ptr += 256;
                }
                for (; i < size; i++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];
                    *outptr8++ = ptr[8];
                    *outptr9++ = ptr[9];
                    *outptra++ = ptr[10];
                    *outptrb++ = ptr[11];
                    *outptrc++ = ptr[12];
                    *outptrd++ = ptr[13];
                    *outptre++ = ptr[14];
                    *outptrf++ = ptr[15];

                    ptr += 16;
                }
            }
        }
#endif // __AVX512F__

        if (elempack == 8) // out_elempack == 8 || out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr0 = (float*)top_blob + size * q * 8;
                float* outptr1 = (float*)top_blob + size * (q * 8 + 1);
                float* outptr2 = (float*)top_blob + size * (q * 8 + 2);
                float* outptr3 = (float*)top_blob + size * (q * 8 + 3);
                float* outptr4 = (float*)top_blob + size * (q * 8 + 4);
                float* outptr5 = (float*)top_blob + size * (q * 8 + 5);
                float* outptr6 = (float*)top_blob + size * (q * 8 + 6);
                float* outptr7 = (float*)top_blob + size * (q * 8 + 7);

                int i = 0;
                for (; i + 7 < size; i += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr);
                    __m256 _row1 = _mm256_loadu_ps(ptr + 8);
                    __m256 _row2 = _mm256_loadu_ps(ptr + 16);
                    __m256 _row3 = _mm256_loadu_ps(ptr + 24);
                    __m256 _row4 = _mm256_loadu_ps(ptr + 32);
                    __m256 _row5 = _mm256_loadu_ps(ptr + 40);
                    __m256 _row6 = _mm256_loadu_ps(ptr + 48);
                    __m256 _row7 = _mm256_loadu_ps(ptr + 56);

                    transpose8x8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr0, _row0);
                    _mm256_storeu_ps(outptr1, _row1);
                    _mm256_storeu_ps(outptr2, _row2);
                    _mm256_storeu_ps(outptr3, _row3);
                    _mm256_storeu_ps(outptr4, _row4);
                    _mm256_storeu_ps(outptr5, _row5);
                    _mm256_storeu_ps(outptr6, _row6);
                    _mm256_storeu_ps(outptr7, _row7);

                    outptr0 += 8;
                    outptr1 += 8;
                    outptr2 += 8;
                    outptr3 += 8;
                    outptr4 += 8;
                    outptr5 += 8;
                    outptr6 += 8;
                    outptr7 += 8;
                    ptr += 64;
                }
                for (; i < size; i++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];

                    ptr += 8;
                }
            }
        }
#endif // __AVX__

        if (elempack == 4) // out_elempack == 4 || out_elempack == 8 || out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr0 = (float*)top_blob + size * q * 4;
                float* outptr1 = (float*)top_blob + size * (q * 4 + 1);
                float* outptr2 = (float*)top_blob + size * (q * 4 + 2);
                float* outptr3 = (float*)top_blob + size * (q * 4 + 3);

                int i = 0;
                for (; i + 3 < size; i += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr);
                    __m128 _row1 = _mm_loadu_ps(ptr + 4);
                    __m128 _row2 = _mm_loadu_ps(ptr + 8);
                    __m128 _row3 = _mm_loadu_ps(ptr + 12);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr0, _row0);
                    _mm_storeu_ps(outptr1, _row1);
                    _mm_storeu_ps(outptr2, _row2);
                    _mm_storeu_ps(outptr3, _row3);

                    ptr += 16;
                    outptr0 += 4;
                    outptr1 += 4;
                    outptr2 += 4;
                    outptr3 += 4;
                }
                for (; i < size; i++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];

                    ptr += 4;
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1) // out_elempack == 4 || out_elempack == 8 || out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = (float*)top_blob + size * q;

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _v = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(outptr, _v);
                    ptr += 8;
                    outptr += 8;
                }
#endif
                for (; i < size; i++)
                {
                    *outptr++ = *ptr++;
                }
            }
        }
    }

    return 0;
}